

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O1

void write_file(bsdtar *bsdtar,archive *a,archive_entry *entry)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  la_int64_t lVar4;
  
  iVar1 = archive_write_header(a,entry);
  if (iVar1 != 0) {
    if (bsdtar->verbose < 2) {
      pcVar2 = archive_entry_pathname(entry);
      pcVar3 = archive_error_string(a);
      lafe_warnc(0,"%s: %s",pcVar2,pcVar3);
    }
    else {
      safe_fprintf(_stderr,"a ");
      list_item_verbose(bsdtar,_stderr,entry);
      pcVar2 = archive_error_string(a);
      lafe_warnc(0,": %s",pcVar2);
    }
    if (iVar1 == -0x1e) goto LAB_00110202;
  }
  if (-0x15 < iVar1) {
    lVar4 = archive_entry_size(entry);
    if (0 < lVar4) {
      iVar1 = copy_file_data_block(bsdtar,a,bsdtar->diskreader,entry);
      if (iVar1 != 0) {
LAB_00110202:
        exit(1);
      }
    }
  }
  return;
}

Assistant:

static void
write_file(struct bsdtar *bsdtar, struct archive *a,
    struct archive_entry *entry)
{
	write_entry(bsdtar, a, entry);
}